

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS quilt(REF_MPI ref_mpi,int argc,char **argv)

{
  char *__s;
  REF_BOOL RVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  double dVar5;
  ulong local_860;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT auto_tparams;
  REF_DBL *global_params;
  char local_828 [4];
  REF_INT pos;
  char output_egads [1024];
  char project [1000];
  size_t end_of_string;
  char *input_egads;
  REF_GEOM ref_geom;
  char **argv_local;
  REF_MPI pRStack_18;
  int argc_local;
  REF_MPI ref_mpi_local;
  
  _ref_private_macro_code_rxs = (REF_DBL *)0x0;
  ref_private_macro_code_rxs_1 = 1;
  ref_geom = (REF_GEOM)argv;
  argv_local._4_4_ = argc;
  pRStack_18 = ref_mpi;
  if (argc < 3) {
    if (ref_mpi->id == 0) {
      quilt_help(*argv);
    }
    ref_mpi_local._4_4_ = 1;
  }
  else {
    __s = argv[2];
    RVar1 = ref_egads_allows_construction();
    if (RVar1 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1022,"quilt","EGADS not linked with OpenCASCADE, required to load model");
      ref_mpi_local._4_4_ = 1;
    }
    else {
      RVar1 = ref_egads_allows_effective();
      if (RVar1 == 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1023,"quilt","EGADS does not support Effective Geometry");
        ref_mpi_local._4_4_ = 1;
      }
      else {
        sVar4 = strlen(__s);
        if (sVar4 < 0x400) {
          local_860 = strlen(__s);
        }
        else {
          local_860 = 0x3ff;
        }
        if ((local_860 < 8) || (iVar2 = strncmp(__s + (local_860 - 6),".egads",6), iVar2 != 0)) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1028,"quilt",".egads extension missing");
          ref_mpi_local._4_4_ = 1;
        }
        else {
          strncpy(output_egads + 0x3f8,__s,local_860 - 6);
          output_egads[local_860 + 0x3f2] = '\0';
          snprintf(local_828,0x400,"%s-eff.egads",output_egads + 0x3f8);
          uVar3 = ref_args_find(argv_local._4_4_,(char **)ref_geom,"--global",
                                (REF_INT *)((long)&global_params + 4));
          if ((uVar3 == 0) || (uVar3 == 5)) {
            if ((global_params._4_4_ == -1) || (argv_local._4_4_ + -3 <= global_params._4_4_)) {
              if (pRStack_18->id == 0) {
                printf("initial tessellation, default param\n");
              }
            }
            else {
              _ref_private_macro_code_rxs = (double *)malloc(0x18);
              if (_ref_private_macro_code_rxs == (double *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x102f,"quilt","malloc global_params of REF_DBL NULL");
                return 2;
              }
              dVar5 = atof(*(char **)(&ref_geom->n + (long)(global_params._4_4_ + 1) * 2));
              *_ref_private_macro_code_rxs = dVar5;
              dVar5 = atof(*(char **)(&ref_geom->n + (long)(global_params._4_4_ + 2) * 2));
              _ref_private_macro_code_rxs[1] = dVar5;
              dVar5 = atof(*(char **)(&ref_geom->n + (long)(global_params._4_4_ + 3) * 2));
              _ref_private_macro_code_rxs[2] = dVar5;
              if (pRStack_18->id == 0) {
                printf("initial tessellation, global param %f %f %f\n",*_ref_private_macro_code_rxs,
                       _ref_private_macro_code_rxs[1],_ref_private_macro_code_rxs[2]);
              }
            }
            uVar3 = ref_args_find(argv_local._4_4_,(char **)ref_geom,"--auto-tparams",
                                  (REF_INT *)((long)&global_params + 4));
            if ((uVar3 == 0) || (uVar3 == 5)) {
              if ((global_params._4_4_ != -1) && (global_params._4_4_ < argv_local._4_4_ + -1)) {
                ref_private_macro_code_rxs_1 =
                     atoi(*(char **)(&ref_geom->n + (long)(global_params._4_4_ + 1) * 2));
                if (pRStack_18->id == 0) {
                  printf("--auto-tparams %d requested\n",(ulong)(uint)ref_private_macro_code_rxs_1);
                }
                if ((ref_private_macro_code_rxs_1 < 0) &&
                   (ref_private_macro_code_rxs_1 = 7, pRStack_18->id == 0)) {
                  printf("--auto-tparams %d set to all\n",7);
                }
              }
              uVar3 = ref_geom_create((REF_GEOM *)&input_egads);
              if (uVar3 == 0) {
                uVar3 = ref_egads_load((REF_GEOM)input_egads,__s);
                if (uVar3 == 0) {
                  if ((pRStack_18->id == 0) && (*(int *)(input_egads + 0x78) != 0)) {
                    printf("EBody Effective Body loaded\n");
                  }
                  uVar3 = ref_egads_quilt((REF_GEOM)input_egads,ref_private_macro_code_rxs_1,
                                          _ref_private_macro_code_rxs);
                  if (uVar3 == 0) {
                    uVar3 = ref_egads_save((REF_GEOM)input_egads,local_828);
                    if (uVar3 == 0) {
                      uVar3 = ref_geom_free((REF_GEOM)input_egads);
                      if (uVar3 == 0) {
                        if (_ref_private_macro_code_rxs != (REF_DBL *)0x0) {
                          free(_ref_private_macro_code_rxs);
                        }
                        ref_mpi_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0x104d,"quilt",(ulong)uVar3,"free geom/context");
                        ref_mpi_local._4_4_ = uVar3;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0x104c,"quilt",(ulong)uVar3,"save");
                      ref_mpi_local._4_4_ = uVar3;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0x104b,"quilt",(ulong)uVar3);
                    ref_mpi_local._4_4_ = uVar3;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0x1048,"quilt",(ulong)uVar3,"load");
                  ref_mpi_local._4_4_ = uVar3;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x1047,"quilt",(ulong)uVar3,"create geom");
                ref_mpi_local._4_4_ = uVar3;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x103b,"quilt",(ulong)uVar3,"arg search");
              ref_mpi_local._4_4_ = uVar3;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x102d,"quilt",(ulong)uVar3,"arg search");
            ref_mpi_local._4_4_ = uVar3;
          }
        }
      }
    }
  }
  return ref_mpi_local._4_4_;
}

Assistant:

static REF_STATUS quilt(REF_MPI ref_mpi, int argc, char *argv[]) {
  REF_GEOM ref_geom;
  char *input_egads;
  size_t end_of_string;
  char project[1000];
  char output_egads[1024];
  REF_INT pos;
  REF_DBL *global_params = NULL;
  REF_INT auto_tparams = REF_EGADS_RECOMMENDED_TPARAM;

  if (argc < 3) goto shutdown;
  input_egads = argv[2];

  RAS(ref_egads_allows_construction(),
      "EGADS not linked with OpenCASCADE, required to load model")
  RAS(ref_egads_allows_effective(), "EGADS does not support Effective Geometry")

  end_of_string = MIN(1023, strlen(input_egads));
  RAS((7 < end_of_string &&
       strncmp(&(input_egads[end_of_string - 6]), ".egads", 6) == 0),
      ".egads extension missing");
  strncpy(project, input_egads, end_of_string - 6);
  project[end_of_string - 6] = '\0';
  snprintf(output_egads, 1024, "%s-eff.egads", project);

  RXS(ref_args_find(argc, argv, "--global", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos < argc - 3) {
    ref_malloc(global_params, 3, REF_DBL);
    global_params[0] = atof(argv[pos + 1]);
    global_params[1] = atof(argv[pos + 2]);
    global_params[2] = atof(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi))
      printf("initial tessellation, global param %f %f %f\n", global_params[0],
             global_params[1], global_params[2]);
  } else {
    if (ref_mpi_once(ref_mpi)) printf("initial tessellation, default param\n");
  }

  RXS(ref_args_find(argc, argv, "--auto-tparams", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    auto_tparams = atoi(argv[pos + 1]);
    if (ref_mpi_once(ref_mpi))
      printf("--auto-tparams %d requested\n", auto_tparams);
    if (auto_tparams < 0) {
      auto_tparams = REF_EGADS_ALL_TPARAM;
      if (ref_mpi_once(ref_mpi))
        printf("--auto-tparams %d set to all\n", auto_tparams);
    }
  }

  RSS(ref_geom_create(&ref_geom), "create geom");
  RSS(ref_egads_load(ref_geom, input_egads), "load");
  if (ref_mpi_once(ref_mpi) && ref_geom_effective(ref_geom))
    printf("EBody Effective Body loaded\n");
  RSS(ref_egads_quilt(ref_geom, auto_tparams, global_params), "quilt");
  RSS(ref_egads_save(ref_geom, output_egads), "save");
  RSS(ref_geom_free(ref_geom), "free geom/context");

  ref_free(global_params);
  global_params = NULL;

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) quilt_help(argv[0]);
  return REF_FAILURE;
}